

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  int iVar1;
  HashElem *pHVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  FKey *pFVar6;
  u32 uVar7;
  Index *pIdx;
  uint h;
  Index *local_40;
  uint local_34;
  
  uVar7 = 0;
  if ((pParse->db->flags & 0x80000) != 0) {
    uVar7 = 0;
    for (pFVar6 = pTab->pFKey; pFVar6 != (FKey *)0x0; pFVar6 = pFVar6->pNextFrom) {
      if (0 < (long)pFVar6->nCol) {
        lVar5 = 0;
        do {
          iVar1 = *(int *)((long)&pFVar6->aCol[0].iFrom + lVar5);
          uVar4 = 1 << ((byte)iVar1 & 0x1f);
          if (0x1f < iVar1) {
            uVar4 = 0xffffffff;
          }
          uVar7 = uVar7 | uVar4;
          lVar5 = lVar5 + 0x10;
        } while ((long)pFVar6->nCol * 0x10 != lVar5);
      }
    }
    pHVar2 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,&local_34);
    if ((pHVar2 != (HashElem *)0x0) && (pFVar6 = (FKey *)pHVar2->data, pFVar6 != (FKey *)0x0)) {
      do {
        local_40 = (Index *)0x0;
        sqlite3FkLocateIndex(pParse,pTab,pFVar6,&local_40,(int **)0x0);
        if ((local_40 != (Index *)0x0) && ((ulong)local_40->nKeyCol != 0)) {
          uVar3 = 0;
          do {
            uVar4 = 1 << ((byte)local_40->aiColumn[uVar3] & 0x1f);
            if (0x1f < local_40->aiColumn[uVar3]) {
              uVar4 = 0xffffffff;
            }
            uVar7 = uVar7 | uVar4;
            uVar3 = uVar3 + 1;
          } while (local_40->nKeyCol != uVar3);
        }
        pFVar6 = pFVar6->pNextTo;
      } while (pFVar6 != (FKey *)0x0);
    }
  }
  return uVar7;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *p;
    int i;
    for(p=pTab->pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nKeyCol; i++) mask |= COLUMN_MASK(pIdx->aiColumn[i]);
      }
    }
  }
  return mask;
}